

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void duckdb::DecimalRoundNegativePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  int iVar1;
  hugeint_t *phVar2;
  hugeint_t *phVar3;
  unsigned_long *puVar4;
  data_ptr_t pdVar5;
  sel_t *idx;
  byte bVar6;
  byte bVar7;
  BoundFunctionExpression *pBVar8;
  pointer pFVar9;
  const_reference pvVar10;
  pointer pEVar11;
  long lVar12;
  reference vector;
  ulong uVar13;
  idx_t iVar14;
  idx_t iVar15;
  ValidityMask *pVVar16;
  ulong uVar17;
  ValidityMask *other;
  ulong uVar18;
  ulong uVar19;
  idx_t count;
  void *in_R8;
  data_ptr_t pdVar20;
  int64_t *piVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  bool bVar25;
  hugeint_t input_00;
  hugeint_t input_01;
  hugeint_t input_02;
  hugeint_t input_03;
  hugeint_t hVar26;
  ValidityMask local_d8;
  data_ptr_t local_b8;
  UnifiedVectorFormat local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_68;
  hugeint_t local_58;
  hugeint_t addition;
  
  pBVar8 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(&state->expr->super_BaseExpression)
  ;
  pFVar9 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->(&pBVar8->bind_info);
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(&pBVar8->children,0);
  pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar10);
  bVar6 = DecimalType::GetScale(&pEVar11->return_type);
  pvVar10 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::get<true>(&pBVar8->children,0);
  pEVar11 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar10);
  bVar7 = DecimalType::GetWidth(&pEVar11->return_type);
  iVar1 = *(int *)&pFVar9[1]._vptr_FunctionData;
  if ((int)((uint)bVar6 - (uint)bVar7) < iVar1) {
    lVar12 = (long)(int)((uint)bVar6 - iVar1) * 0x10;
    local_58.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + lVar12);
    local_58.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + lVar12 + 8);
    iVar15 = (long)iVar1 * -0x10;
    local_68._vptr__Sp_counted_base = *(_func_int ***)(Hugeint::POWERS_OF_TEN + iVar15);
    local_68._8_8_ = *(undefined8 *)(Hugeint::POWERS_OF_TEN + iVar15 + 8);
    hugeint_t::hugeint_t((hugeint_t *)&local_b0,2);
    addition = hugeint_t::operator/(&local_58,(hugeint_t *)&local_b0);
    vector = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
    count = input->count;
    local_d8.super_TemplatedValidityMask<unsigned_long>.validity_mask = &addition.lower;
    local_d8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)&local_58;
    local_d8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = &local_68;
    if (vector->vector_type == FLAT_VECTOR) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar20 = result->data;
      pdVar5 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      FlatVector::VerifyFlatVector(result);
      if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        lVar12 = 8;
        while (bVar25 = count != 0, count = count - 1, bVar25) {
          hVar26.upper = *(int64_t *)(pdVar5 + lVar12);
          hVar26.lower = *(uint64_t *)(pdVar5 + lVar12 + -8);
          hVar26 = UnaryLambdaWrapper::
                   Operation<duckdb::DecimalRoundNegativePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_,duckdb::hugeint_t,duckdb::hugeint_t>
                             (hVar26,&local_d8,iVar15,in_R8);
          *(uint64_t *)(pdVar20 + lVar12 + -8) = hVar26.lower;
          *(int64_t *)(pdVar20 + lVar12) = hVar26.upper;
          lVar12 = lVar12 + 0x10;
        }
      }
      else {
        other = &vector->validity;
        TemplatedValidityMask<unsigned_long>::Initialize
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                   &other->super_TemplatedValidityMask<unsigned_long>);
        local_d8.super_TemplatedValidityMask<unsigned_long>.capacity = count + 0x3f >> 6;
        uVar24 = 0;
        local_b8 = pdVar20;
        for (uVar17 = 0; uVar17 != local_d8.super_TemplatedValidityMask<unsigned_long>.capacity;
            uVar17 = uVar17 + 1) {
          puVar4 = (other->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar18 = uVar24 + 0x40;
            if (count <= uVar24 + 0x40) {
              uVar18 = count;
            }
LAB_00cfb75f:
            uVar22 = uVar24 << 4 | 8;
            pVVar16 = other;
            for (; uVar13 = uVar24, uVar24 < uVar18; uVar24 = uVar24 + 1) {
              input_00.upper = *(int64_t *)(pdVar5 + uVar22);
              input_00.lower = *(uint64_t *)(pdVar5 + (uVar22 - 8));
              hVar26 = UnaryLambdaWrapper::
                       Operation<duckdb::DecimalRoundNegativePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_,duckdb::hugeint_t,duckdb::hugeint_t>
                                 (input_00,&local_d8,(idx_t)pVVar16,in_R8);
              *(uint64_t *)(pdVar20 + (uVar22 - 8)) = hVar26.lower;
              *(int64_t *)(pdVar20 + uVar22) = hVar26.upper;
              uVar22 = uVar22 + 0x10;
            }
          }
          else {
            uVar22 = puVar4[uVar17];
            uVar18 = uVar24 + 0x40;
            if (count <= uVar24 + 0x40) {
              uVar18 = count;
            }
            if (uVar22 == 0xffffffffffffffff) goto LAB_00cfb75f;
            uVar13 = uVar18;
            if (uVar22 != 0) {
              uVar23 = uVar24 << 4 | 8;
              pVVar16 = other;
              for (uVar19 = 0; uVar13 = uVar24 + uVar19, uVar24 + uVar19 < uVar18;
                  uVar19 = uVar19 + 1) {
                if ((uVar22 >> (uVar19 & 0x3f) & 1) != 0) {
                  input_01.upper = *(int64_t *)(pdVar5 + uVar23);
                  input_01.lower = *(uint64_t *)(pdVar5 + (uVar23 - 8));
                  hVar26 = UnaryLambdaWrapper::
                           Operation<duckdb::DecimalRoundNegativePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_,duckdb::hugeint_t,duckdb::hugeint_t>
                                     (input_01,&local_d8,(idx_t)pVVar16,in_R8);
                  *(uint64_t *)(local_b8 + (uVar23 - 8)) = hVar26.lower;
                  *(int64_t *)(local_b8 + uVar23) = hVar26.upper;
                  pdVar20 = local_b8;
                }
                uVar23 = uVar23 + 0x10;
              }
            }
          }
          uVar24 = uVar13;
        }
      }
    }
    else if (vector->vector_type == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      phVar2 = (hugeint_t *)result->data;
      phVar3 = (hugeint_t *)vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        ConstantVector::SetNull(result,false);
        hVar26 = UnaryLambdaWrapper::
                 Operation<duckdb::DecimalRoundNegativePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_,duckdb::hugeint_t,duckdb::hugeint_t>
                           (*phVar3,&local_d8,iVar15,in_R8);
        *phVar2 = hVar26;
      }
      else {
        ConstantVector::SetNull(result,true);
      }
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_b0);
      Vector::ToUnifiedFormat(vector,count,&local_b0);
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar20 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        piVar21 = (int64_t *)(pdVar20 + 8);
        for (iVar15 = 0; count != iVar15; iVar15 = iVar15 + 1) {
          idx = (local_b0.sel)->sel_vector;
          iVar14 = iVar15;
          if (idx != (sel_t *)0x0) {
            iVar14 = (idx_t)idx[iVar15];
          }
          input_03.upper = *(int64_t *)(local_b0.data + iVar14 * 0x10 + 8);
          input_03.lower = *(uint64_t *)(local_b0.data + iVar14 * 0x10);
          hVar26 = UnaryLambdaWrapper::
                   Operation<duckdb::DecimalRoundNegativePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_,duckdb::hugeint_t,duckdb::hugeint_t>
                             (input_03,&local_d8,(idx_t)idx,in_R8);
          piVar21[-1] = hVar26.lower;
          *piVar21 = hVar26.upper;
          piVar21 = piVar21 + 2;
        }
      }
      else {
        piVar21 = (int64_t *)(pdVar20 + 8);
        for (iVar15 = 0; count != iVar15; iVar15 = iVar15 + 1) {
          iVar14 = iVar15;
          if ((local_b0.sel)->sel_vector != (sel_t *)0x0) {
            iVar14 = (idx_t)(local_b0.sel)->sel_vector[iVar15];
          }
          if ((local_b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar14 >> 6] >> (iVar14 & 0x3f) & 1) == 0) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar15);
          }
          else {
            input_02.upper = *(int64_t *)(local_b0.data + iVar14 * 0x10 + 8);
            input_02.lower = *(uint64_t *)(local_b0.data + iVar14 * 0x10);
            hVar26 = UnaryLambdaWrapper::
                     Operation<duckdb::DecimalRoundNegativePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::hugeint_t)_1_,duckdb::hugeint_t,duckdb::hugeint_t>
                               (input_02,&local_d8,
                                local_b0.validity.super_TemplatedValidityMask<unsigned_long>.
                                validity_mask[iVar14 >> 6],in_R8);
            piVar21[-1] = hVar26.lower;
            *piVar21 = hVar26.upper;
          }
          piVar21 = piVar21 + 2;
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&local_b0);
    }
  }
  else {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    Value::INTEGER((Value *)&local_b0,0);
    Vector::SetValue(result,0,(Value *)&local_b0);
    Value::~Value((Value *)&local_b0);
  }
  return;
}

Assistant:

static void DecimalRoundNegativePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	auto width = DecimalType::GetWidth(func_expr.children[0]->return_type);
	if (info.target_scale <= -int32_t(width - source_scale)) {
		// scale too big for width
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		result.SetValue(0, Value::INTEGER(0));
		return;
	}
	T divide_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale + source_scale]);
	T multiply_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale]);
	T addition = divide_power_of_ten / 2;

	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / divide_power_of_ten * multiply_power_of_ten);
	});
}